

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O0

OffsetDataList * __thiscall
QTimeZone::transitions(QTimeZone *this,QDateTime *fromDateTime,QDateTime *toDateTime)

{
  undefined1 uVar1;
  bool bVar2;
  TimeSpec TVar3;
  const_iterator o;
  QDateTime *in_RCX;
  QTimeZone *in_RDX;
  ShortData *in_RSI;
  OffsetDataList *in_RDI;
  long in_FS_OFFSET;
  Data *pdata;
  DataList *__range3;
  const_iterator __end3;
  const_iterator __begin3;
  DataList plist;
  OffsetDataList list;
  rvalue_ref in_stack_fffffffffffffed8;
  Data *in_stack_fffffffffffffee0;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff0c;
  undefined7 in_stack_ffffffffffffff28;
  QTimeZonePrivate *in_stack_ffffffffffffff30;
  QDateTime *in_stack_ffffffffffffff48;
  OffsetDataList *asize;
  const_iterator local_80;
  QList<QTimeZonePrivate::Data> local_78;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  asize = in_RDI;
  QList<QTimeZone::OffsetData>::QList((QList<QTimeZone::OffsetData> *)0x581791);
  uVar1 = Data::isShort((Data *)in_RSI);
  if ((bool)uVar1) {
    TVar3 = ShortData::spec(in_RSI);
    if (TVar3 == LocalTime) {
      systemTimeZone();
      transitions(in_RDX,in_RCX,in_stack_ffffffffffffff48);
      ~QTimeZone((QTimeZone *)0x58183f);
      goto LAB_00581aa8;
    }
  }
  else {
    bVar2 = hasTransitions((QTimeZone *)
                           CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    uVar4 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff08);
    if (bVar2) {
      local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      Data::operator->((Data *)in_RSI);
      QDateTime::toMSecsSinceEpoch((QDateTime *)CONCAT44(in_stack_ffffffffffffff0c,uVar4));
      QDateTime::toMSecsSinceEpoch((QDateTime *)CONCAT44(in_stack_ffffffffffffff0c,uVar4));
      QTimeZonePrivate::transitions
                (in_stack_ffffffffffffff30,CONCAT17(uVar1,in_stack_ffffffffffffff28),(qint64)in_RSI)
      ;
      QList<QTimeZonePrivate::Data>::size(&local_78);
      QList<QTimeZone::OffsetData>::reserve
                ((QList<QTimeZone::OffsetData> *)CONCAT17(uVar1,in_stack_ffffffffffffff28),
                 (qsizetype)asize);
      local_80.i = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_80 = QList<QTimeZonePrivate::Data>::begin(in_stack_fffffffffffffee0);
      o = QList<QTimeZonePrivate::Data>::end(in_stack_fffffffffffffee0);
      while (bVar2 = QList<QTimeZonePrivate::Data>::const_iterator::operator!=(&local_80,o), bVar2)
      {
        in_stack_fffffffffffffee0 =
             QList<QTimeZonePrivate::Data>::const_iterator::operator*(&local_80);
        QTimeZonePrivate::toOffsetData((Data *)CONCAT17(uVar1,in_stack_ffffffffffffff28));
        QList<QTimeZone::OffsetData>::append
                  ((QList<QTimeZone::OffsetData> *)in_stack_fffffffffffffee0,
                   in_stack_fffffffffffffed8);
        OffsetData::~OffsetData((OffsetData *)in_stack_fffffffffffffee0);
        QList<QTimeZonePrivate::Data>::const_iterator::operator++(&local_80);
      }
      QList<QTimeZonePrivate::Data>::~QList((QList<QTimeZonePrivate::Data> *)0x581a7b);
    }
  }
  QList<QTimeZone::OffsetData>::QList
            ((QList<QTimeZone::OffsetData> *)in_stack_fffffffffffffee0,
             (QList<QTimeZone::OffsetData> *)in_stack_fffffffffffffed8);
LAB_00581aa8:
  QList<QTimeZone::OffsetData>::~QList((QList<QTimeZone::OffsetData> *)0x581ab5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QTimeZone::OffsetDataList QTimeZone::transitions(const QDateTime &fromDateTime,
                                                 const QDateTime &toDateTime) const
{
    OffsetDataList list;
    if (d.isShort()) {
        switch (d.s.spec()) {
        case Qt::LocalTime:
            return systemTimeZone().transitions(fromDateTime, toDateTime);
        case Qt::UTC:
        case Qt::OffsetFromUTC:
            break;
        case Qt::TimeZone:
            Q_UNREACHABLE();
            break;
        }
    } else if (hasTransitions()) {
        const QTimeZonePrivate::DataList plist = d->transitions(fromDateTime.toMSecsSinceEpoch(),
                                                                toDateTime.toMSecsSinceEpoch());
        list.reserve(plist.size());
        for (const QTimeZonePrivate::Data &pdata : plist)
            list.append(QTimeZonePrivate::toOffsetData(pdata));
    }
    return list;
}